

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeContainer.hpp
# Opt level: O0

bool __thiscall
OpenMD::TypeContainer<OpenMD::TorsionType,_4>::add
          (TypeContainer<OpenMD::TorsionType,_4> *this,KeyType *keys,ElemPtr elem)

{
  byte bVar1;
  pair<int,_OpenMD::TorsionType_*> *in_RSI;
  int *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>,_bool>
  pVar2;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  value_type *__x;
  pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>
  *this_00;
  pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>
  local_50;
  _Base_ptr local_28;
  undefined1 local_20;
  
  __x = (value_type *)(in_RDI + 2);
  *in_RDI = *in_RDI + 1;
  std::make_pair<int,OpenMD::TorsionType*&>
            (&in_RSI->first,
             (TorsionType **)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  this_00 = &local_50;
  std::
  pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>
  ::
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::pair<int,_OpenMD::TorsionType_*>,_true>
            (this_00,&__x->first,in_RSI);
  pVar2 = std::
          map<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>_>
          ::insert((map<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>_>
                    *)this_00,__x);
  local_28 = (_Base_ptr)pVar2.first._M_node;
  bVar1 = pVar2.second;
  local_20 = bVar1;
  std::
  pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>
  ::~pair((pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>
           *)0x20e049);
  return (bool)(bVar1 & 1);
}

Assistant:

bool add(KeyType& keys, ElemPtr elem) {
      assert(keys.size() == SIZE);
      assert(elem);
      return data_.insert(value_type(keys, std::make_pair(index_++, elem)))
          .second;
    }